

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

void __thiscall Assimp::FIIntValueImpl::~FIIntValueImpl(FIIntValueImpl *this)

{
  pointer pcVar1;
  pointer piVar2;
  
  (this->super_FIIntValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008c0288;
  pcVar1 = (this->strValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->strValue).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_FIIntValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_008c02c8;
  piVar2 = (this->super_FIIntValue).value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

inline FIIntValueImpl(std::vector<int32_t> &&value_): strValueValid(false) { value = std::move(value_); }